

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

PyObject * libxml_xmlURIPtrWrap(xmlURIPtr uri)

{
  PyObject *ret;
  xmlURIPtr uri_local;
  
  if (uri == (xmlURIPtr)0x0) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    uri_local = (xmlURIPtr)&_Py_NoneStruct;
  }
  else {
    uri_local = (xmlURIPtr)PyCapsule_New(uri,"xmlURIPtr",0);
  }
  return (PyObject *)uri_local;
}

Assistant:

PyObject *
libxml_xmlURIPtrWrap(xmlURIPtr uri)
{
    PyObject *ret;

    if (uri == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    ret = PyCapsule_New((void *) uri, (char *) "xmlURIPtr", NULL);
    return (ret);
}